

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

char * __thiscall
MemoryLeakDetector::allocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,size_t size,char *file,
          size_t line,bool allocatNodesSeperately)

{
  MemoryLeakDetectorNode MVar1;
  MemLeakPeriod MVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MemoryLeakDetectorNode *pMVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  size_t sVar4;
  
  uVar8 = size + 3 & 0xfffffffffffffff8;
  iVar3 = (*allocator->_vptr_TestMemoryAllocator[2])
                    (allocator,uVar8 + (ulong)!allocatNodesSeperately * 0x40 + 8,file,line);
  sVar4 = CONCAT44(extraout_var,iVar3);
  if (sVar4 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    if (allocatNodesSeperately) {
      iVar3 = (*allocator->_vptr_TestMemoryAllocator[8])(allocator,0x40);
      pMVar5 = (MemoryLeakDetectorNode *)CONCAT44(extraout_var_00,iVar3);
    }
    else {
      pMVar5 = (MemoryLeakDetectorNode *)(uVar8 + sVar4 + 8);
    }
    uVar6 = this->allocationSequenceNumber_;
    this->allocationSequenceNumber_ = uVar6 + 1;
    MVar2 = this->current_period_;
    MVar1 = (MemoryLeakDetectorNode)this->current_allocation_stage_;
    *(uint *)(pMVar5 + 8) = uVar6;
    *(size_t *)(pMVar5 + 0x10) = sVar4;
    *(size_t *)pMVar5 = size;
    *(TestMemoryAllocator **)(pMVar5 + 0x28) = allocator;
    *(MemLeakPeriod *)(pMVar5 + 0x30) = MVar2;
    pMVar5[0x34] = MVar1;
    *(char **)(pMVar5 + 0x18) = file;
    *(size_t *)(pMVar5 + 0x20) = line;
    *(undefined1 *)(sVar4 + 2 + size) = 0x53;
    *(undefined2 *)(sVar4 + size) = 0x4142;
    pcVar7 = *(char **)(pMVar5 + 0x10);
    uVar6 = (int)pcVar7 + (int)((ulong)pcVar7 / 0x49) * -0x49;
    *(MemoryLeakDetectorNode **)(pMVar5 + 0x38) = (this->memoryTable_).table_[uVar6].head_;
    (this->memoryTable_).table_[uVar6].head_ = pMVar5;
  }
  return pcVar7;
}

Assistant:

char* MemoryLeakDetector::allocMemory(TestMemoryAllocator* allocator, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    /* With malloc, it is harder to guarantee that the allocator free is called.
     * This is because operator new is overloaded via linker symbols, but malloc just via #defines.
     * If the same allocation is used and the wrong free is called, it will deallocate the memory leak information
     * without the memory leak detector ever noticing it!
     * So, for malloc, we'll allocate the memory separately so we can detect this and give a proper error.
     */

    char* memory = allocateMemoryWithAccountingInformation(allocator, size, file, line, allocatNodesSeperately);
    if (memory == NULLPTR) return NULLPTR;
    MemoryLeakDetectorNode* node = createMemoryLeakAccountingInformation(allocator, size, memory, allocatNodesSeperately);

    storeLeakInformation(node, memory, size, allocator, file, line);
    return node->memory_;
}